

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O3

bool bssl::apply_remote_features(SSL *ssl,CBS *in)

{
  unsigned_short *puVar1;
  SSL_CONFIG *pSVar2;
  tuple<bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> this;
  _Head_base<0UL,_stack_st_SSL_CIPHER_*,_false> sk;
  bool bVar3;
  int iVar4;
  pointer __p;
  SSL_CIPHER *pSVar5;
  size_t sVar6;
  _Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false> _Var7;
  void *p;
  size_t sVar8;
  OPENSSL_STACK *pOVar9;
  unsigned_short *puVar10;
  pointer __p_00;
  uint16_t configured_group;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  iterator __begin1;
  Span<const_unsigned_short> SVar14;
  uint16_t id_1;
  Array<unsigned_short> new_configured_groups;
  UniquePtr<struct_stack_st_SSL_CIPHER> unsupported;
  UniquePtr<struct_stack_st_SSL_CIPHER> supported;
  CBS groups;
  Array<unsigned_short> supported_groups;
  CBS ciphers;
  uint16_t local_aa;
  Array<unsigned_short> local_a8;
  _Head_base<0UL,_stack_st_SSL_CIPHER_*,_false> local_98;
  _Head_base<0UL,_stack_st_SSL_CIPHER_*,_false> local_90;
  CBS local_88;
  Array<unsigned_short> local_78;
  CBS *local_60;
  CBS local_58;
  CBS local_40;
  
  local_60 = in;
  iVar4 = CBS_get_asn1(in,&local_40,4);
  if (iVar4 == 0) {
    return false;
  }
  local_90._M_head_impl = (stack_st_SSL_CIPHER *)OPENSSL_sk_new_null();
  if ((OPENSSL_STACK *)local_90._M_head_impl == (OPENSSL_STACK *)0x0) {
LAB_001400f2:
    bVar3 = false;
    goto LAB_00140161;
  }
  if (local_40.len != 0) {
    do {
      iVar4 = CBS_get_u16(&local_40,(uint16_t *)&local_88);
      if (iVar4 == 0) goto LAB_001400f2;
      pSVar5 = SSL_get_cipher_by_value((uint16_t)local_88.data);
      if ((pSVar5 != (SSL_CIPHER *)0x0) &&
         (sVar6 = OPENSSL_sk_push((OPENSSL_STACK *)local_90._M_head_impl,pSVar5), sVar6 == 0))
      goto LAB_001400f2;
    } while (local_40.len != 0);
  }
  _Var7._M_head_impl =
       *(SSLCipherPreferenceList **)
        &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
         super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
  if ((tuple<bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>)_Var7._M_head_impl ==
      (_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)0x0) {
    _Var7._M_head_impl =
         *(SSLCipherPreferenceList **)
          &(((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->cipher_list)._M_t.
           super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
  }
  pOVar9 = *(OPENSSL_STACK **)_Var7._M_head_impl;
  local_98._M_head_impl = (stack_st_SSL_CIPHER *)OPENSSL_sk_new_null();
  if ((OPENSSL_STACK *)local_98._M_head_impl == (OPENSSL_STACK *)0x0) {
LAB_00140155:
    bVar3 = false;
  }
  else {
    sVar6 = OPENSSL_sk_num(pOVar9);
    if (sVar6 != 0) {
      sVar12 = 0;
      do {
        p = OPENSSL_sk_value(pOVar9,sVar12);
        iVar4 = OPENSSL_sk_find((OPENSSL_STACK *)local_90._M_head_impl,(size_t *)0x0,p,
                                sk_SSL_CIPHER_call_cmp_func);
        if ((iVar4 == 0) &&
           (sVar8 = OPENSSL_sk_push((OPENSSL_STACK *)local_98._M_head_impl,p), sVar8 == 0))
        goto LAB_00140155;
        sVar12 = sVar12 + 1;
      } while (sVar6 != sVar12);
    }
    sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)local_98._M_head_impl);
    if ((sVar6 != 0) &&
       ((_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)
        *(_Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> *)
         &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t
            .super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
          super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> ==
        (SSLCipherPreferenceList *)0x0)) {
      __p_00 = (pointer)OPENSSL_malloc(0x10);
      if (__p_00 != (pointer)0x0) {
        (__p_00->ciphers)._M_t.super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>.
        _M_t.super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl =
             (stack_st_SSL_CIPHER *)0x0;
        __p_00->in_group_flags = (bool *)0x0;
      }
      local_88.data = (uint8_t *)0x0;
      std::__uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)
                 &((ssl->config)._M_t.
                   super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list,
                 __p_00);
      std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)&local_88);
      this.super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> *)
            &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
             super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
      if ((this.super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>._M_head_impl ==
           (_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)0x0) ||
         (bVar3 = SSLCipherPreferenceList::Init
                            ((SSLCipherPreferenceList *)
                             this.
                             super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>
                             .super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>.
                             _M_head_impl,
                             (SSLCipherPreferenceList *)
                             (((ssl->ctx)._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->cipher_list
                             )._M_t.
                             super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>
                            ), !bVar3)) goto LAB_00140155;
    }
    sk._M_head_impl = local_98._M_head_impl;
    sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)local_98._M_head_impl);
    if (sVar6 != 0) {
      sVar12 = 0;
      do {
        pSVar5 = (SSL_CIPHER *)OPENSSL_sk_value((OPENSSL_STACK *)sk._M_head_impl,sVar12);
        SSLCipherPreferenceList::Remove
                  ((SSLCipherPreferenceList *)
                   (((ssl->config)._M_t.
                     super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list).
                   _M_t.
                   super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>,
                   pSVar5);
        sVar12 = sVar12 + 1;
      } while (sVar6 != sVar12);
    }
    pOVar9 = (OPENSSL_STACK *)SSL_get_ciphers((SSL *)ssl);
    sVar6 = OPENSSL_sk_num(pOVar9);
    if ((sVar6 == 0) || (iVar4 = CBS_get_asn1(local_60,&local_88,4), iVar4 == 0)) goto LAB_00140155;
    local_78.data_ = (unsigned_short *)0x0;
    local_78.size_ = 0;
    bVar3 = Array<unsigned_short>::InitUninitialized(&local_78,local_88.len >> 1);
    if (bVar3) {
      if (local_88.len != 0) {
        uVar13 = 0;
        do {
          iVar4 = CBS_get_u16(&local_88,(uint16_t *)&local_a8);
          if (iVar4 == 0) goto LAB_0014017f;
          if (local_78.size_ <= uVar13) goto LAB_0014019f;
          local_78.data_[uVar13] = (unsigned_short)local_a8.data_;
          uVar13 = uVar13 + 1;
        } while (local_88.len != 0);
      }
      SVar14 = tls1_get_grouplist((ssl->s3->hs)._M_t.
                                  super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)
      ;
      sVar6 = SVar14.size_;
      puVar10 = SVar14.data_;
      local_a8.data_ = (unsigned_short *)0x0;
      local_a8.size_ = 0;
      bVar3 = Array<unsigned_short>::InitUninitialized(&local_a8,sVar6);
      if ((bVar3) && (sVar6 != 0)) {
        puVar1 = puVar10 + sVar6;
        uVar13 = 0;
        do {
          if (local_78.size_ != 0) {
            lVar11 = 0;
            do {
              if (*(unsigned_short *)((long)local_78.data_ + lVar11) == *puVar10) {
                if (local_a8.size_ <= uVar13) goto LAB_0014019f;
                local_a8.data_[uVar13] = *puVar10;
                uVar13 = uVar13 + 1;
                break;
              }
              lVar11 = lVar11 + 2;
            } while (local_78.size_ * 2 != lVar11);
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar1);
        if (uVar13 == 0) goto LAB_00140183;
        if (local_a8.size_ < uVar13) {
LAB_0014019f:
          abort();
        }
        pSVar2 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>
                 ._M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
        local_a8.size_ = uVar13;
        OPENSSL_free((pSVar2->supported_group_list).data_);
        (pSVar2->supported_group_list).data_ = local_a8.data_;
        (pSVar2->supported_group_list).size_ = local_a8.size_;
        local_a8.data_ = (unsigned_short *)0x0;
        local_a8.size_ = 0;
        local_58.data = (uint8_t *)0x0;
        local_58.len = 0;
        iVar4 = CBS_get_optional_asn1(local_60,&local_58,(int *)0x0,0x80000000);
        if (iVar4 == 0) goto LAB_00140183;
        if (local_58.len != 0) {
          do {
            iVar4 = CBS_get_u16(&local_58,&local_aa);
            if (iVar4 == 0) goto LAB_00140183;
            if (local_aa == 0x4469) {
              if ((((ssl->config)._M_t.
                    super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->field_0x10e &
                  0x20) == 0) goto LAB_0014019b;
            }
            else if ((local_aa == 0x44cd) &&
                    ((((ssl->config)._M_t.
                       super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->field_0x10e &
                     0x20) != 0)) {
LAB_0014019b:
              bVar3 = true;
              goto LAB_00140185;
            }
          } while (local_58.len != 0);
        }
        bVar3 = true;
        Vector<bssl::ALPSConfig>::clear
                  (&((ssl->config)._M_t.
                     super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->alps_configs);
      }
      else {
LAB_00140183:
        bVar3 = false;
      }
LAB_00140185:
      Array<unsigned_short>::~Array(&local_a8);
    }
    else {
LAB_0014017f:
      bVar3 = false;
    }
    OPENSSL_free(local_78.data_);
  }
  std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&local_98);
LAB_00140161:
  std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&local_90);
  return bVar3;
}

Assistant:

static bool apply_remote_features(SSL *ssl, CBS *in) {
  CBS ciphers;
  if (!CBS_get_asn1(in, &ciphers, CBS_ASN1_OCTETSTRING)) {
    return false;
  }
  bssl::UniquePtr<STACK_OF(SSL_CIPHER)> supported(sk_SSL_CIPHER_new_null());
  if (!supported) {
    return false;
  }
  while (CBS_len(&ciphers)) {
    uint16_t id;
    if (!CBS_get_u16(&ciphers, &id)) {
      return false;
    }
    const SSL_CIPHER *cipher = SSL_get_cipher_by_value(id);
    if (!cipher) {
      continue;
    }
    if (!sk_SSL_CIPHER_push(supported.get(), cipher)) {
      return false;
    }
  }
  STACK_OF(SSL_CIPHER) *configured =
      ssl->config->cipher_list ? ssl->config->cipher_list->ciphers.get()
                               : ssl->ctx->cipher_list->ciphers.get();
  bssl::UniquePtr<STACK_OF(SSL_CIPHER)> unsupported(sk_SSL_CIPHER_new_null());
  if (!unsupported) {
    return false;
  }
  for (const SSL_CIPHER *configured_cipher : configured) {
    if (sk_SSL_CIPHER_find(supported.get(), nullptr, configured_cipher)) {
      continue;
    }
    if (!sk_SSL_CIPHER_push(unsupported.get(), configured_cipher)) {
      return false;
    }
  }
  if (sk_SSL_CIPHER_num(unsupported.get()) && !ssl->config->cipher_list) {
    ssl->config->cipher_list = bssl::MakeUnique<SSLCipherPreferenceList>();
    if (!ssl->config->cipher_list ||
        !ssl->config->cipher_list->Init(*ssl->ctx->cipher_list)) {
      return false;
    }
  }
  for (const SSL_CIPHER *unsupported_cipher : unsupported.get()) {
    ssl->config->cipher_list->Remove(unsupported_cipher);
  }
  if (sk_SSL_CIPHER_num(SSL_get_ciphers(ssl)) == 0) {
    return false;
  }

  CBS groups;
  if (!CBS_get_asn1(in, &groups, CBS_ASN1_OCTETSTRING)) {
    return false;
  }
  Array<uint16_t> supported_groups;
  if (!supported_groups.InitForOverwrite(CBS_len(&groups) / 2)) {
    return false;
  }
  size_t idx = 0;
  while (CBS_len(&groups)) {
    uint16_t group;
    if (!CBS_get_u16(&groups, &group)) {
      return false;
    }
    supported_groups[idx++] = group;
  }
  Span<const uint16_t> configured_groups =
      tls1_get_grouplist(ssl->s3->hs.get());
  Array<uint16_t> new_configured_groups;
  if (!new_configured_groups.InitForOverwrite(configured_groups.size())) {
    return false;
  }
  idx = 0;
  for (uint16_t configured_group : configured_groups) {
    bool ok = false;
    for (uint16_t supported_group : supported_groups) {
      if (supported_group == configured_group) {
        ok = true;
        break;
      }
    }
    if (ok) {
      new_configured_groups[idx++] = configured_group;
    }
  }
  if (idx == 0) {
    return false;
  }
  new_configured_groups.Shrink(idx);
  ssl->config->supported_group_list = std::move(new_configured_groups);

  CBS alps;
  CBS_init(&alps, nullptr, 0);
  if (!CBS_get_optional_asn1(in, &alps, /*out_present=*/nullptr,
                             kHandoffTagALPS)) {
    return false;
  }
  bool supports_alps = false;
  while (CBS_len(&alps) != 0) {
    uint16_t id;
    if (!CBS_get_u16(&alps, &id)) {
      return false;
    }
    // For now, we support two ALPS codepoints, so we need to extract both
    // codepoints, and then filter what the handshaker might try to send.
    if ((id == TLSEXT_TYPE_application_settings &&
         ssl->config->alps_use_new_codepoint) ||
        (id == TLSEXT_TYPE_application_settings_old &&
         !ssl->config->alps_use_new_codepoint)) {
      supports_alps = true;
      break;
    }
  }
  if (!supports_alps) {
    ssl->config->alps_configs.clear();
  }

  return true;
}